

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coptccal.cpp
# Opt level: O2

int __thiscall
icu_63::CopticCalendar::clone
          (CopticCalendar *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  CopticCalendar *this_00;
  
  this_00 = (CopticCalendar *)UMemory::operator_new((UMemory *)0x268,(size_t)__fn);
  if (this_00 != (CopticCalendar *)0x0) {
    CopticCalendar(this_00,this);
  }
  return (int)this_00;
}

Assistant:

Calendar*
CopticCalendar::clone() const
{
    return new CopticCalendar(*this);
}